

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O0

CHole * __thiscall Refal2::CHole::operator=(CHole *this,CHole *hole)

{
  CHole *hole_local;
  CHole *this_local;
  
  this->left = hole->left;
  this->right = hole->right;
  CNodeList<Refal2::CUnit>::Move((CNodeList<Refal2::CUnit> *)hole,(CNodeList<Refal2::CUnit> *)this);
  return this;
}

Assistant:

CHole& CHole::operator=( const CHole& hole )
{
	left = hole.left;
	right = hole.right;
	const_cast<CHole&>( hole ).Move( *this );
	return *this;
}